

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

int capnp::(anonymous_namespace)::checkRoundTrip<int,double>(double value)

{
  double value_local;
  Fault f;
  
  if (((double)(int)value != value) || (NAN((double)(int)value) || NAN(value))) {
    value_local = value;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],double&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6ca,FAILED,"U(result) == value",
               "\"Value out-of-range for requested type.\", value",
               (char (*) [39])"Value out-of-range for requested type.",&value_local);
    kj::_::Debug::Fault::~Fault(&f);
  }
  return (int)value;
}

Assistant:

T checkRoundTrip(U value) {
#if __aarch64__
  // Work around an apparently broken compiler optimization on Clang / arm64. It appears that
  // for T = int8_t, U = double, and value = 128, the compiler incorrectly believes that the
  // round-trip does not change the value, where in fact it should change to -128. Similar problems
  // exist for various other types and inputs -- json-test seems to exercise several problem cases.
  // The problem only exists when compiling with optimization. In any case, declaring the variable
  // `volatile` kills the optimization.
  volatile
#endif
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}